

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

int arkInterpInit_Lagrange(void *arkode_mem,ARKInterp I,realtype tnew)

{
  int iVar1;
  void *pvVar2;
  long *in_RSI;
  ARKodeMem in_RDI;
  undefined8 in_XMM0_Qa;
  ARKodeMem ark_mem;
  int i;
  N_Vector in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    local_4 = -0x15;
  }
  else {
    if (*(int *)(*in_RSI + 4) < *(int *)*in_RSI) {
      if (*(long *)(*in_RSI + 0x10) != 0) {
        free(*(void **)(*in_RSI + 0x10));
        *(undefined8 *)(*in_RSI + 0x10) = 0;
      }
      if (*(long *)(*in_RSI + 8) != 0) {
        for (iVar3 = 0; iVar3 < *(int *)*in_RSI; iVar3 = iVar3 + 1) {
          if (*(long *)(*(long *)(*in_RSI + 8) + (long)iVar3 * 8) != 0) {
            arkFreeVec(in_RDI,(N_Vector *)in_stack_ffffffffffffffc8);
            *(undefined8 *)(*(long *)(*in_RSI + 8) + (long)iVar3 * 8) = 0;
          }
        }
        free(*(void **)(*in_RSI + 8));
        *(undefined8 *)(*in_RSI + 8) = 0;
      }
    }
    if (*(long *)(*in_RSI + 0x10) == 0) {
      pvVar2 = malloc((long)*(int *)*in_RSI << 3);
      *(void **)(*in_RSI + 0x10) = pvVar2;
      if (*(long *)(*in_RSI + 0x10) == 0) {
        arkInterpFree(in_RDI,(ARKInterp)in_stack_ffffffffffffffc8);
        return -0x14;
      }
    }
    if (*(long *)(*in_RSI + 8) == 0) {
      pvVar2 = malloc((long)*(int *)*in_RSI << 3);
      *(void **)(*in_RSI + 8) = pvVar2;
      if (*(long *)(*in_RSI + 8) == 0) {
        arkInterpFree(in_RDI,(ARKInterp)in_stack_ffffffffffffffc8);
        return -0x14;
      }
      for (iVar3 = 0; iVar3 < *(int *)*in_RSI; iVar3 = iVar3 + 1) {
        *(undefined8 *)(*(long *)(*in_RSI + 8) + (long)iVar3 * 8) = 0;
        iVar1 = arkAllocVec((ARKodeMem)CONCAT44(iVar3,in_stack_ffffffffffffffd8),(N_Vector)in_RDI,
                            (N_Vector *)in_stack_ffffffffffffffc8);
        if (iVar1 == 0) {
          arkInterpFree(in_RDI,(ARKInterp)in_stack_ffffffffffffffc8);
          return -0x14;
        }
      }
    }
    if (*(int *)(*in_RSI + 4) < *(int *)*in_RSI) {
      *(undefined4 *)(*in_RSI + 4) = *(undefined4 *)*in_RSI;
    }
    for (iVar3 = 0; iVar3 < *(int *)(*in_RSI + 4); iVar3 = iVar3 + 1) {
      *(undefined8 *)(*(long *)(*in_RSI + 0x10) + (long)iVar3 * 8) = 0;
    }
    iVar3 = N_VConstVectorArray((int)((ulong)in_XMM0_Qa >> 0x20),
                                (realtype)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                                (N_Vector *)in_RDI);
    if (iVar3 == 0) {
      **(undefined8 **)(*in_RSI + 0x10) = in_XMM0_Qa;
      N_VScale((realtype)in_RDI,in_stack_ffffffffffffffc8,(N_Vector)0x11483d9);
      *(undefined4 *)(*in_RSI + 0x18) = 1;
      local_4 = 0;
    }
    else {
      local_4 = -0x1c;
    }
  }
  return local_4;
}

Assistant:

int arkInterpInit_Lagrange(void* arkode_mem, ARKInterp I,
                           realtype tnew)
{
  int i;
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(ARK_MEM_NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* check if storage has increased since the last init */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I)) {
    if (LINT_THIST(I) != NULL) {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }
    if (LINT_YHIST(I) != NULL) {
      for (i=0; i<LINT_NMAX(I); i++) {
        if (LINT_YJ(I,i) != NULL) {
          arkFreeVec(ark_mem, &(LINT_YJ(I,i)));
          LINT_YJ(I,i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
  }

  /* allocate storage for time and solution histories */
  if (LINT_THIST(I) == NULL) {
    LINT_THIST(I) = (realtype*) malloc(LINT_NMAX(I) * sizeof(realtype));
    if (LINT_THIST(I) == NULL) {
      arkInterpFree(ark_mem, I); return(ARK_MEM_FAIL);
    }
  }

  /* solution history allocation */
  if (LINT_YHIST(I) == NULL) {
    LINT_YHIST(I) = (N_Vector*) malloc(LINT_NMAX(I) * sizeof(N_Vector));
    if (LINT_YHIST(I) == NULL) {
      arkInterpFree(ark_mem, I); return(ARK_MEM_FAIL);
    }
    for (i=0; i<LINT_NMAX(I); i++) {
      LINT_YJ(I,i) = NULL;
      if (!arkAllocVec(ark_mem, ark_mem->yn, &(LINT_YJ(I,i)))) {
        arkInterpFree(ark_mem, I); return(ARK_MEM_FAIL);
      }
    }
  }

  /* update allocated size if necesary */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I))
    LINT_NMAXALLOC(I) = LINT_NMAX(I);

  /* zero out history (to be safe) */
  for (i=0; i<LINT_NMAXALLOC(I); i++)
    LINT_TJ(I,i) = RCONST(0.0);
  if (N_VConstVectorArray(LINT_NMAXALLOC(I), RCONST(0.0), LINT_YHIST(I)))
    return(ARK_VECTOROP_ERR);

  /* set current time and state as first entries of (t,y) history, update counter */
  LINT_TJ(I,0) = tnew;
  N_VScale(ONE, ark_mem->yn, LINT_YJ(I,0));
  LINT_NHIST(I) = 1;

  /* return with success */
  return(ARK_SUCCESS);
}